

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createIntrinsicCall
          (LLVMReadWriteGraphBuilder *this,CallInst *CInst)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  uint64_t uVar4;
  char cVar5;
  bool bVar6;
  raw_ostream *prVar7;
  uint64_t uVar8;
  RWNode *pRVar9;
  ulong uVar10;
  Offset OVar11;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  undefined1 auVar12 [16];
  pair<std::_Rb_tree_iterator<const_llvm::Value_*>,_bool> pVar13;
  const_iterator __begin2;
  Offset from;
  const_iterator __end2;
  pair<bool,_dg::LLVMPointsToSet> pts;
  const_iterator local_a0;
  RWNode *local_98;
  Offset local_90;
  Offset local_88;
  undefined1 local_80 [16];
  LLVMReadWriteGraphBuilder *local_70;
  CallInst *local_68;
  ValInfo local_60;
  ValInfo local_58;
  const_iterator local_50;
  GenericDefSite<dg::dda::RWNode> local_48;
  
  uVar1 = *(int *)(*(long *)(CInst + -0x20) + 0x24) - 0xbf;
  if ((uVar1 < 6) && ((0x29U >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar2 = *(undefined8 *)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5));
    lVar3 = *(long *)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5) + 0x40);
    local_98 = ReadWriteGraph::create(&this->graph,GENERIC);
    (**(code **)(*(long *)this->PTA + 0x10))(&local_48,this->PTA,uVar2);
    if ((char)local_48.target == '\0') {
      prVar7 = (raw_ostream *)llvm::errs();
      Str.Length = 0x39;
      Str.Data = "[RWG] Error: No points-to information for destination in\n";
      llvm::raw_ostream::operator<<(prVar7,Str);
      prVar7 = (raw_ostream *)llvm::errs();
      local_80._0_8_ = CInst;
      prVar7 = operator<<(prVar7,(ValInfo *)local_80);
      Str_00.Length = 1;
      Str_00.Data = "\n";
      llvm::raw_ostream::operator<<(prVar7,Str_00);
    }
    uVar4 = Offset::UNKNOWN;
    uVar8 = Offset::UNKNOWN;
    local_68 = CInst;
    if (lVar3 != 0 && *(char *)(lVar3 + 0x10) == '\x10') {
      uVar8 = llvm::APInt::getLimitedValue((APInt *)(lVar3 + 0x18),0xffffffffffffffff);
    }
    OVar11.offset = local_48.offset.offset;
    if (((long *)local_48.offset.offset != (long *)0x0) &&
       (cVar5 = (**(code **)(*(long *)local_48.offset.offset + 0x38))(local_48.offset.offset),
       cVar5 != '\0')) {
      OVar11.offset = 0;
    }
    local_50.impl = (LLVMPointsToSetImpl *)0x0;
    local_a0.impl = (LLVMPointsToSetImpl *)OVar11.offset;
    bVar6 = LLVMPointsToSet::const_iterator::operator==(&local_a0,&local_50);
    if (!bVar6) {
      local_70 = this;
      do {
        auVar12 = (**(code **)(*(long *)local_a0.impl + 0x48))();
        uVar10 = auVar12._8_8_;
        local_80 = auVar12;
        if (auVar12._0_8_[0x10] != (Value)0x0) {
          if (uVar4 == uVar10) {
            uVar8 = uVar4;
          }
          local_90.offset = uVar4;
          if (uVar8 < uVar4 - uVar10) {
            local_90.offset = uVar10 + uVar8;
            if (uVar4 - uVar8 <= uVar10) {
              local_90.offset = uVar4;
            }
            if (uVar4 == uVar10) {
              local_90.offset = uVar4;
            }
          }
          local_88.offset = uVar10;
          pRVar9 = getOperand(this,auVar12._0_8_);
          if (pRVar9 == (RWNode *)0x0) {
            if (createIntrinsicCall(llvm::CallInst_const*)::warned == '\0') {
              createIntrinsicCall();
            }
            pVar13 = std::
                     _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                     ::_M_insert_unique<llvm::Value_const*const&>
                               ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                                 *)&createIntrinsicCall::warned,(Value **)local_80);
            pRVar9 = UNKNOWN_MEMORY;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              prVar7 = (raw_ostream *)llvm::errs();
              Str_01.Length = 0xf;
              Str_01.Data = "[RWG] error at ";
              prVar7 = llvm::raw_ostream::operator<<(prVar7,Str_01);
              local_58.v = (Value *)local_68;
              prVar7 = operator<<(prVar7,&local_58);
              Str_02.Length = 1;
              Str_02.Data = "\n";
              prVar7 = llvm::raw_ostream::operator<<(prVar7,Str_02);
              Str_03.Length = 0x27;
              Str_03.Data = "[RWG] error: Haven\'t created node for: ";
              prVar7 = llvm::raw_ostream::operator<<(prVar7,Str_03);
              local_60.v = (Value *)local_80._0_8_;
              prVar7 = operator<<(prVar7,&local_60);
              this = local_70;
              Str_04.Length = 1;
              Str_04.Data = "\n";
              llvm::raw_ostream::operator<<(prVar7,Str_04);
              pRVar9 = UNKNOWN_MEMORY;
            }
          }
          RWNode::addDef(local_98,pRVar9,&local_88,&local_90,
                         local_90.offset != uVar4 && local_88.offset != uVar4);
        }
        (**(code **)(*(long *)local_a0.impl + 0x40))();
        cVar5 = (**(code **)(*(long *)local_a0.impl + 0x38))();
        if (cVar5 != '\0') {
          local_a0.impl = (LLVMPointsToSetImpl *)0x0;
        }
        bVar6 = LLVMPointsToSet::const_iterator::operator==(&local_a0,&local_50);
      } while (!bVar6);
    }
    if ((long *)local_48.offset.offset != (long *)0x0) {
      (**(code **)(*(long *)local_48.offset.offset + 0x58))();
    }
  }
  else {
    if (*(int *)(*(long *)(CInst + -0x20) + 0x24) != 0x134) {
      pRVar9 = createUnknownCall(this,CInst);
      return pRVar9;
    }
    local_98 = ReadWriteGraph::create(&this->graph,ALLOC);
    local_48.offset.offset = 0;
    local_48.len.offset = Offset::UNKNOWN;
    local_48.target = local_98;
    std::
    _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
    ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
              ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                *)&local_98->annotations,&local_48);
  }
  return local_98;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createIntrinsicCall(const llvm::CallInst *CInst) {
    using namespace llvm;

    const IntrinsicInst *I = cast<IntrinsicInst>(CInst);
    const Value *dest;
    const Value *lenVal;

    RWNode *ret;
    switch (I->getIntrinsicID()) {
    case Intrinsic::memmove:
    case Intrinsic::memcpy:
    case Intrinsic::memset:
        // memcpy/set <dest>, <src/val>, <len>
        dest = I->getOperand(0);
        lenVal = I->getOperand(2);
        break;
    case Intrinsic::vastart:
        // we create this node because this nodes works
        // as ALLOC in points-to, so we can have
        // reaching definitions to that
        ret = &create(RWNodeType::ALLOC);
        ret->addDef(ret, 0, Offset::UNKNOWN);
        return ret;
    default:
        return createUnknownCall(CInst);
    }

    ret = &create(RWNodeType::GENERIC);

    auto pts = PTA->getLLVMPointsToChecked(dest);
    if (!pts.first) {
        llvm::errs()
                << "[RWG] Error: No points-to information for destination in\n";
        llvm::errs() << ValInfo(I) << "\n";
        // continue, the points-to set is {unknown}
    }

    uint64_t len = Offset::UNKNOWN;
    if (const ConstantInt *C = dyn_cast<ConstantInt>(lenVal))
        len = C->getLimitedValue();

    for (const auto &ptr : pts.second) {
        if (llvm::isa<llvm::Function>(ptr.value))
            continue;

        Offset from, to;
        if (ptr.offset.isUnknown()) {
            // if the offset is UNKNOWN, use whole memory
            from = Offset::UNKNOWN;
            len = Offset::UNKNOWN;
        } else {
            from = *ptr.offset;
        }

        // do not allow overflow
        if (Offset::UNKNOWN - *from > len)
            to = from + len;
        else
            to = Offset::UNKNOWN;

        RWNode *target = getOperand(ptr.value);
        // assert(target && "Don't have pointer target for intrinsic call");
        if (!target) {
            // keeping such set is faster then printing it all to terminal
            // ... and we don't flood the terminal that way
            static std::set<const llvm::Value *> warned;
            if (warned.insert(ptr.value).second) {
                llvm::errs() << "[RWG] error at " << ValInfo(CInst) << "\n"
                             << "[RWG] error: Haven't created node for: "
                             << ValInfo(ptr.value) << "\n";
            }
            target = UNKNOWN_MEMORY;
        }

        // add the definition
        ret->addDef(target, from, to,
                    !from.isUnknown() && !to.isUnknown() /* strong update */);
    }

    return ret;
}